

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O1

void __thiscall
xLearn::FFMScore::calc_grad_ftrl(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  real_t rVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  undefined8 uVar13;
  float fVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint *puVar25;
  uint *puVar26;
  long lVar27;
  long lVar28;
  uint *puVar29;
  uint uVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  float fVar34;
  undefined1 auVar39 [16];
  float fVar35;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar48 [16];
  
  auVar44._4_60_ = in_register_00001244;
  auVar44._0_4_ = norm;
  if (norm < 0.0) {
    fVar34 = sqrtf(norm);
  }
  else {
    auVar40 = vsqrtss_avx(auVar44._0_16_,auVar44._0_16_);
    fVar34 = auVar40._0_4_;
  }
  auVar40 = in_ZMM6._0_16_;
  uVar9 = *(uint *)(model + 0x48);
  uVar10 = *(uint *)(model + 0x4c);
  lVar27 = *(long *)row;
  if (lVar27 != *(long *)(row + 8)) {
    lVar12 = *(long *)(model + 0x58);
    do {
      uVar11 = *(uint *)(lVar27 + 4);
      if (uVar11 < uVar9) {
        uVar22 = (ulong)(uVar11 * 3);
        uVar23 = (ulong)(uVar11 * 3 + 1);
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(pg * *(float *)(lVar27 + 8) * fVar34)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416(*(uint *)(lVar12 + uVar22 * 4)));
        fVar35 = *(float *)(lVar12 + uVar23 * 4);
        auVar40 = vfmadd213ss_fma(auVar38,auVar38,ZEXT416((uint)fVar35));
        fVar32 = auVar40._0_4_;
        *(float *)(lVar12 + uVar23 * 4) = fVar32;
        if (fVar32 < 0.0) {
          fVar32 = sqrtf(fVar32);
        }
        else {
          auVar40 = vsqrtss_avx(auVar40,auVar40);
          fVar32 = auVar40._0_4_;
        }
        if (fVar35 < 0.0) {
          fVar35 = sqrtf(fVar35);
        }
        else {
          auVar40 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
          fVar35 = auVar40._0_4_;
        }
        uVar21 = (ulong)(uVar11 * 3 + 2);
        auVar40._0_4_ = (fVar32 - fVar35) / (this->super_Score).alpha_;
        auVar40._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar40 = vfnmadd231ss_fma(ZEXT416(auVar38._0_4_),auVar40,
                                   ZEXT416(*(uint *)(lVar12 + uVar22 * 4)));
        fVar32 = auVar40._0_4_ + *(float *)(lVar12 + uVar21 * 4);
        *(float *)(lVar12 + uVar21 * 4) = fVar32;
        auVar38 = ZEXT816(0);
        uVar13 = vcmpss_avx512f(auVar38,ZEXT416((uint)fVar32),1);
        bVar15 = (bool)((byte)uVar13 & 1);
        fVar14 = (float)((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x40800000);
        fVar35 = (this->super_Score).lambda_1_;
        if (fVar35 < fVar32 * fVar14) {
          fVar7 = (this->super_Score).beta_;
          fVar33 = *(float *)(lVar12 + uVar23 * 4);
          if (fVar33 < 0.0) {
            fVar33 = sqrtf(fVar33);
          }
          else {
            auVar40 = vsqrtss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33));
            fVar33 = auVar40._0_4_;
          }
          auVar40 = vfmsub213ss_fma(ZEXT416((uint)fVar35),ZEXT416((uint)fVar14),
                                    ZEXT416((uint)fVar32));
          auVar38._0_4_ =
               auVar40._0_4_ /
               ((fVar7 + fVar33) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar38._4_12_ = auVar40._4_12_;
        }
        *(int *)(lVar12 + uVar22 * 4) = auVar38._0_4_;
      }
      auVar40 = in_ZMM6._0_16_;
      lVar27 = lVar27 + 0xc;
    } while (lVar27 != *(long *)(row + 8));
  }
  puVar25 = *(uint **)(model + 0x68);
  fVar34 = (float)puVar25[1];
  auVar38 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar34));
  fVar35 = auVar38._0_4_;
  puVar25[1] = (uint)fVar35;
  if (fVar35 < 0.0) {
    fVar35 = sqrtf(fVar35);
  }
  else {
    auVar38 = vsqrtss_avx(auVar38,auVar38);
    fVar35 = auVar38._0_4_;
  }
  if (fVar34 < 0.0) {
    fVar34 = sqrtf(fVar34);
  }
  else {
    auVar38 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
    fVar34 = auVar38._0_4_;
  }
  auVar39._0_4_ = (fVar35 - fVar34) / (this->super_Score).alpha_;
  auVar39._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar38 = vfnmadd132ss_fma(auVar39,ZEXT416((uint)pg),ZEXT416(*puVar25));
  fVar35 = auVar38._0_4_ + (float)puVar25[2];
  puVar25[2] = (uint)fVar35;
  auVar42._0_12_ = ZEXT812(0);
  auVar42._12_4_ = 0;
  uVar13 = vcmpss_avx512f(auVar42,ZEXT416((uint)fVar35),1);
  bVar15 = (bool)((byte)uVar13 & 1);
  fVar32 = (float)((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x40800000);
  fVar34 = (this->super_Score).lambda_1_;
  if (fVar34 < fVar35 * fVar32) {
    auVar38 = vfmsub213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar32),ZEXT416((uint)fVar35));
    fVar34 = (this->super_Score).beta_;
    fVar35 = (float)puVar25[1];
    if (fVar35 < 0.0) {
      fVar35 = sqrtf(fVar35);
      auVar38 = ZEXT416(auVar38._0_4_);
    }
    else {
      auVar39 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar35 = auVar39._0_4_;
    }
    auVar42._0_4_ =
         auVar38._0_4_ /
         ((fVar34 + fVar35) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
    auVar42._4_12_ = auVar38._4_12_;
  }
  *puVar25 = auVar42._0_4_;
  puVar25 = *(uint **)row;
  if (puVar25 != *(uint **)(row + 8)) {
    auVar40 = vcvtusi2ss_avx512f(auVar40,*(undefined4 *)(model + 0x50));
    auVar40 = ZEXT416((uint)(auVar40._0_4_ * 0.25));
    auVar40 = vroundss_avx(auVar40,auVar40,10);
    iVar20 = vcvttss2usi_avx512f(auVar40);
    uVar11 = iVar20 * 0xc;
    iVar20 = *(int *)(model + 0x4c);
    lVar27 = *(long *)(model + 0x60);
    rVar8 = (this->super_Score).alpha_;
    fVar34 = (this->super_Score).lambda_2_;
    do {
      if ((*puVar25 < uVar10 && puVar25[1] < uVar9) && (puVar25 + 3 != *(uint **)(row + 8))) {
        uVar22 = (ulong)(puVar25[1] * iVar20 * uVar11);
        uVar23 = (ulong)(*puVar25 * uVar11);
        fVar35 = (float)puVar25[2];
        puVar26 = puVar25;
        puVar29 = puVar25 + 3;
        do {
          if ((puVar26[3] < uVar10 && puVar26[4] < uVar9) && (uVar11 != 0)) {
            uVar21 = (ulong)(puVar26[3] * uVar11);
            lVar12 = lVar27 + uVar22 * 4 + uVar21 * 4;
            uVar24 = (ulong)(puVar26[4] * iVar20 * uVar11);
            lVar2 = lVar27 + uVar23 * 4 + uVar24 * 4;
            fVar32 = fVar35 * (float)puVar26[5] * norm * pg;
            uVar31 = 0;
            do {
              lVar3 = lVar27 + 0x20 + uVar23 * 4 + uVar24 * 4 + uVar31 * 4;
              lVar4 = lVar27 + 0x20 + uVar22 * 4 + uVar21 * 4 + uVar31 * 4;
              pfVar5 = (float *)(lVar12 + uVar31 * 4);
              fVar14 = *pfVar5;
              fVar7 = pfVar5[1];
              fVar33 = pfVar5[2];
              fVar36 = pfVar5[3];
              auVar40 = *(undefined1 (*) [16])(lVar12 + 0x10 + uVar31 * 4);
              pfVar5 = (float *)(lVar2 + uVar31 * 4);
              fVar37 = *pfVar5;
              fVar16 = pfVar5[1];
              fVar17 = pfVar5[2];
              fVar18 = pfVar5[3];
              auVar38 = *(undefined1 (*) [16])(lVar2 + 0x10 + uVar31 * 4);
              auVar45._0_4_ = fVar34 * fVar14 + fVar32 * fVar37;
              auVar45._4_4_ = fVar34 * fVar7 + fVar32 * fVar16;
              auVar45._8_4_ = fVar34 * fVar33 + fVar32 * fVar17;
              auVar45._12_4_ = fVar34 * fVar36 + fVar32 * fVar18;
              auVar46._0_4_ = fVar32 * fVar14 + fVar34 * fVar37;
              auVar46._4_4_ = fVar32 * fVar7 + fVar34 * fVar16;
              auVar46._8_4_ = fVar32 * fVar33 + fVar34 * fVar17;
              auVar46._12_4_ = fVar32 * fVar36 + fVar34 * fVar18;
              auVar47._0_4_ = auVar40._0_4_ + auVar45._0_4_ * auVar45._0_4_;
              auVar47._4_4_ = auVar40._4_4_ + auVar45._4_4_ * auVar45._4_4_;
              auVar47._8_4_ = auVar40._8_4_ + auVar45._8_4_ * auVar45._8_4_;
              auVar47._12_4_ = auVar40._12_4_ + auVar45._12_4_ * auVar45._12_4_;
              auVar39 = vsqrtps_avx(auVar47);
              auVar40 = vsqrtps_avx(auVar40);
              auVar40 = vsubps_avx(auVar39,auVar40);
              auVar19._4_4_ = rVar8;
              auVar19._0_4_ = rVar8;
              auVar19._8_4_ = rVar8;
              auVar19._12_4_ = rVar8;
              auVar40 = vdivps_avx(auVar40,auVar19);
              auVar48._0_4_ = auVar38._0_4_ + auVar46._0_4_ * auVar46._0_4_;
              auVar48._4_4_ = auVar38._4_4_ + auVar46._4_4_ * auVar46._4_4_;
              auVar48._8_4_ = auVar38._8_4_ + auVar46._8_4_ * auVar46._8_4_;
              auVar48._12_4_ = auVar38._12_4_ + auVar46._12_4_ * auVar46._12_4_;
              auVar39 = vsqrtps_avx(auVar48);
              auVar38 = vsqrtps_avx(auVar38);
              auVar38 = vsubps_avx(auVar39,auVar38);
              auVar38 = vdivps_avx(auVar38,auVar19);
              auVar41._0_4_ = fVar14 * auVar40._0_4_;
              auVar41._4_4_ = fVar7 * auVar40._4_4_;
              auVar41._8_4_ = fVar33 * auVar40._8_4_;
              auVar41._12_4_ = fVar36 * auVar40._12_4_;
              auVar40 = vsubps_avx(auVar45,auVar41);
              pfVar5 = (float *)(lVar12 + 0x20 + uVar31 * 4);
              fVar14 = pfVar5[1];
              fVar7 = pfVar5[2];
              fVar33 = pfVar5[3];
              auVar43._0_4_ = fVar37 * auVar38._0_4_;
              auVar43._4_4_ = fVar16 * auVar38._4_4_;
              auVar43._8_4_ = fVar17 * auVar38._8_4_;
              auVar43._12_4_ = fVar18 * auVar38._12_4_;
              auVar38 = vsubps_avx(auVar46,auVar43);
              pfVar6 = (float *)(lVar2 + 0x20 + uVar31 * 4);
              fVar36 = *pfVar6;
              fVar37 = pfVar6[1];
              fVar16 = pfVar6[2];
              fVar17 = pfVar6[3];
              pfVar6 = (float *)(lVar12 + 0x20 + uVar31 * 4);
              *pfVar6 = auVar40._0_4_ + *pfVar5;
              pfVar6[1] = auVar40._4_4_ + fVar14;
              pfVar6[2] = auVar40._8_4_ + fVar7;
              pfVar6[3] = auVar40._12_4_ + fVar33;
              pfVar5 = (float *)(lVar2 + 0x20 + uVar31 * 4);
              *pfVar5 = auVar38._0_4_ + fVar36;
              pfVar5[1] = auVar38._4_4_ + fVar37;
              pfVar5[2] = auVar38._8_4_ + fVar16;
              pfVar5[3] = auVar38._12_4_ + fVar17;
              *(undefined1 (*) [16])(lVar12 + 0x10 + uVar31 * 4) = auVar47;
              *(undefined1 (*) [16])(lVar2 + 0x10 + uVar31 * 4) = auVar48;
              lVar28 = -4;
              do {
                fVar14 = *(float *)(lVar4 + 0x10 + lVar28 * 4);
                auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
                uVar13 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar14),1);
                bVar15 = (bool)((byte)uVar13 & 1);
                fVar33 = (float)((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x40800000);
                fVar7 = (this->super_Score).lambda_1_;
                fVar36 = 0.0;
                if (fVar7 < fVar14 * fVar33) {
                  fVar36 = (this->super_Score).beta_;
                  fVar37 = *(float *)(lVar4 + lVar28 * 4);
                  if (fVar37 < 0.0) {
                    fVar37 = sqrtf(fVar37);
                    auVar44 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar40 = vsqrtss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
                    fVar37 = auVar40._0_4_;
                  }
                  auVar40 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar33),
                                            ZEXT416((uint)fVar14));
                  fVar36 = auVar40._0_4_ /
                           ((fVar36 + fVar37) / (this->super_Score).alpha_ +
                           (this->super_Score).lambda_2_);
                }
                *(float *)(lVar4 + -0x10 + lVar28 * 4) = fVar36;
                fVar14 = *(float *)(lVar3 + 0x10 + lVar28 * 4);
                uVar13 = vcmpss_avx512f(auVar44._0_16_,ZEXT416((uint)fVar14),1);
                bVar15 = (bool)((byte)uVar13 & 1);
                fVar33 = (float)((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x40800000);
                fVar7 = (this->super_Score).lambda_1_;
                if (fVar7 < fVar14 * fVar33) {
                  fVar36 = (this->super_Score).beta_;
                  fVar37 = *(float *)(lVar3 + lVar28 * 4);
                  if (fVar37 < 0.0) {
                    fVar37 = sqrtf(fVar37);
                  }
                  else {
                    auVar40 = vsqrtss_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
                    fVar37 = auVar40._0_4_;
                  }
                  auVar40 = vfmsub213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar33),
                                            ZEXT416((uint)fVar14));
                  auVar44 = ZEXT1664(CONCAT124(auVar40._4_12_,
                                               auVar40._0_4_ /
                                               ((fVar36 + fVar37) / (this->super_Score).alpha_ +
                                               (this->super_Score).lambda_2_)));
                }
                *(int *)(lVar3 + -0x10 + lVar28 * 4) = auVar44._0_4_;
                lVar28 = lVar28 + 1;
              } while (lVar28 != 0);
              uVar30 = (int)uVar31 + 0xc;
              uVar31 = (ulong)uVar30;
            } while (uVar30 < uVar11);
          }
          puVar1 = puVar29 + 3;
          puVar26 = puVar29;
          puVar29 = puVar1;
        } while (puVar1 != *(uint **)(row + 8));
      }
      puVar25 = puVar25 + 3;
    } while (puVar25 != *(uint **)(row + 8));
  }
  return;
}

Assistant:

void FFMScore::calc_grad_ftrl(const SparseRow* row,
                              Model& model,
                              real_t pg,
                              real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 3 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 3;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        real_t *z1 = w1 + kAlign * 2;
        real_t *z2 = w2 + kAlign * 2;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMz1 = _mm_load_ps(z1);
        __m128 XMMz2 = _mm_load_ps(z2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        __m128 XMMsigma1 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg1,
                           _mm_mul_ps(XMMg1, XMMg1))),
                           _mm_sqrt_ps(XMMwg1)), XMMalpha);
        __m128 XMMsigma2 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg2,
                           _mm_mul_ps(XMMg2, XMMg2))),
                           _mm_sqrt_ps(XMMwg2)), XMMalpha);
        XMMz1 = _mm_add_ps(XMMz1,
                _mm_sub_ps(XMMg1,
                _mm_mul_ps(XMMsigma1, XMMw1)));
        XMMz2 = _mm_add_ps(XMMz2,
                _mm_sub_ps(XMMg2,
                _mm_mul_ps(XMMsigma2, XMMw2)));
        _mm_store_ps(z1, XMMz1);
        _mm_store_ps(z2, XMMz2);
        XMMwg1 = _mm_add_ps(XMMwg1,
                 _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2,
                 _mm_mul_ps(XMMg2, XMMg2));
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
        // Update w. SSE may not faster
        for (size_t i = 0; i < kAlign; ++i) {
          // w1
          real_t z1_value = *(z1+i);
          int sign = z1_value > 0 ? 1 : -1;
          if (sign * z1_value <= lambda_1_) {
            *(w1+i) = 0;
          } else {
            *(w1+i) = (sign*lambda_1_-z1_value) / 
              ((beta_ + sqrt(*(wg1+i))) / alpha_ + lambda_2_);
          }
          // w2
          real_t z2_value = *(z2+i);
          sign = z2_value > 0 ? 1 : -1;
          if (sign * z2_value <= lambda_1_) {
            *(w2+i) = 0;
          } else {
            *(w2+i) = (sign*lambda_1_-z2_value) / 
              ((beta_ + sqrt(*(wg2+i))) / alpha_ + lambda_2_);
          }
        }
      }
    }
  }
}